

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindowSettings *pIVar3;
  uint uVar4;
  int iVar5;
  ImGuiWindowSettings *pIVar6;
  char *__function;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar4 = (ctx->Windows).Size;
  if (uVar4 != 0) {
    uVar9 = 0;
    do {
      if ((long)(int)uVar4 <= (long)uVar9) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0011721b;
      }
      pIVar2 = (ctx->Windows).Data[uVar9];
      if ((pIVar2->Flags & 0x100) == 0) {
        iVar1 = pIVar2->SettingsIdx;
        if ((long)iVar1 == -1) {
          pIVar6 = ImGui::FindWindowSettings(pIVar2->ID);
        }
        else {
          if ((ctx->SettingsWindows).Size <= iVar1) goto LAB_001171ef;
          pIVar6 = (ctx->SettingsWindows).Data + iVar1;
        }
        if (pIVar6 == (ImGuiWindowSettings *)0x0) {
          pIVar6 = ImGui::CreateNewWindowSettings(pIVar2->Name);
          pIVar3 = (ctx->SettingsWindows).Data;
          if ((pIVar6 < pIVar3) || (pIVar3 + (ctx->SettingsWindows).Size <= pIVar6)) {
            __assert_fail("it >= Data && it < Data + Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                          ,0x506,
                          "int ImVector<ImGuiWindowSettings>::index_from_ptr(const T *) const [T = ImGuiWindowSettings]"
                         );
          }
          pIVar2->SettingsIdx = (int)((ulong)((long)pIVar6 - (long)pIVar3) >> 3) * -0x55555555;
        }
        if (pIVar6->ID != pIVar2->ID) {
          __assert_fail("settings->ID == window->ID",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                        ,0x249e,
                        "void SettingsHandlerWindow_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                       );
        }
        pIVar6->Pos = (ImVec2ih)((int)(pIVar2->Pos).x & 0xffffU | (int)(pIVar2->Pos).y << 0x10);
        pIVar6->Size = (ImVec2ih)
                       ((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
        pIVar6->Collapsed = pIVar2->Collapsed;
        uVar4 = (ctx->Windows).Size;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar4);
  }
  iVar1 = (buf->Buf).Size;
  iVar5 = iVar1 + -1;
  if (iVar1 == 0) {
    iVar5 = 0;
  }
  ImGuiTextBuffer::reserve(buf,(ctx->SettingsWindows).Size * 0x60 + iVar5);
  uVar4 = (ctx->SettingsWindows).Size;
  uVar9 = (ulong)uVar4;
  if (uVar4 != 0) {
    lVar8 = 0x14;
    uVar7 = 0;
    do {
      if ((long)(int)uVar9 <= (long)uVar7) {
LAB_001171ef:
        __function = "T &ImVector<ImGuiWindowSettings>::operator[](int) [T = ImGuiWindowSettings]";
LAB_0011721b:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                      ,0x4e6,__function);
      }
      pIVar6 = (ctx->SettingsWindows).Data;
      ImGuiTextBuffer::appendf
                (buf,"[%s][%s]\n",handler->TypeName,*(undefined8 *)((long)pIVar6 + lVar8 + -0x14));
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(short *)((long)pIVar6 + lVar8 + -8),
                 (ulong)(uint)(int)*(short *)((long)pIVar6 + lVar8 + -6));
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(short *)((long)pIVar6 + lVar8 + -4),
                 (ulong)(uint)(int)*(short *)((long)pIVar6 + lVar8 + -2));
      ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar6->Name + lVar8));
      ImGuiTextBuffer::appendf(buf,"\n");
      uVar7 = uVar7 + 1;
      uVar9 = (ulong)(uint)(ctx->SettingsWindows).Size;
      lVar8 = lVar8 + 0x18;
    } while (uVar7 != uVar9);
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsIdx != -1) ? &g.SettingsWindows[window->SettingsIdx] : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsIdx = g.SettingsWindows.index_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        buf->appendf("[%s][%s]\n", handler->TypeName, settings->Name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}